

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFParser::parse(QPDFParser *this,InputSource *input,string *object_description,
                 QPDFTokenizer *tokenizer,bool *empty,StringDecrypter *decrypter,QPDF *context)

{
  QPDFTokenizer *object_description_00;
  int iVar1;
  undefined4 extraout_var;
  type tokenizer_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  undefined1 local_f0 [16];
  QPDFParser local_e0;
  StringDecrypter *local_38;
  StringDecrypter *decrypter_local;
  bool *empty_local;
  QPDFTokenizer *tokenizer_local;
  string *object_description_local;
  InputSource *input_local;
  
  local_38 = decrypter;
  decrypter_local = (StringDecrypter *)empty;
  empty_local = (bool *)tokenizer;
  tokenizer_local = (QPDFTokenizer *)object_description;
  object_description_local = (string *)input;
  input_local = (InputSource *)this;
  iVar1 = (*input->_vptr_InputSource[3])();
  make_description((QPDFParser *)local_f0,(string *)CONCAT44(extraout_var,iVar1),
                   (string *)tokenizer_local);
  object_description_00 = tokenizer_local;
  tokenizer_00 = std::unique_ptr<qpdf::Tokenizer,_std::default_delete<qpdf::Tokenizer>_>::operator*
                           ((unique_ptr<qpdf::Tokenizer,_std::default_delete<qpdf::Tokenizer>_> *)
                            empty_local);
  QPDFParser((QPDFParser *)(local_f0 + 0x10),input,
             (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
              *)local_f0,(string *)object_description_00,tokenizer_00,local_38,context,false,0,0,
             false);
  parse(this,(bool *)(local_f0 + 0x10),SUB81(decrypter_local,0));
  ~QPDFParser((QPDFParser *)(local_f0 + 0x10));
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                 *)local_f0);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(
    InputSource& input,
    std::string const& object_description,
    QPDFTokenizer& tokenizer,
    bool& empty,
    QPDFObjectHandle::StringDecrypter* decrypter,
    QPDF* context)
{
    return QPDFParser(
               input,
               make_description(input.getName(), object_description),
               object_description,
               *tokenizer.m,
               decrypter,
               context,
               false)
        .parse(empty, false);
}